

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void __thiscall
SimpleLogger::findMinMaxRevNumInternal
          (SimpleLogger *this,bool *min_revnum_initialized,size_t *min_revnum,size_t *max_revnum,
          string *f_name)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  string ext;
  string local_48 [32];
  
  lVar3 = std::__cxx11::string::rfind((char *)f_name,0x10e6ec);
  if (lVar3 == -1) {
    return;
  }
  std::__cxx11::string::substr((ulong)&ext,(ulong)f_name);
  bVar1 = std::operator==(&ext,"gz");
  if ((bVar1) && (7 < f_name->_M_string_length)) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)f_name);
    std::__cxx11::string::operator=((string *)f_name,local_48);
    std::__cxx11::string::~string(local_48);
    lVar3 = std::__cxx11::string::rfind((char *)f_name,0x10e6ec);
    if (lVar3 == -1) goto LAB_0010b8a6;
    std::__cxx11::string::substr((ulong)local_48,(ulong)f_name);
    std::__cxx11::string::operator=((string *)&ext,local_48);
    std::__cxx11::string::~string(local_48);
    lVar3 = 1;
  }
  else {
    lVar3 = 0;
  }
  iVar2 = atoi(ext._M_dataplus._M_p);
  uVar4 = (ulong)iVar2;
  uVar5 = lVar3 + uVar4;
  if (lVar3 + uVar4 < *max_revnum) {
    uVar5 = *max_revnum;
  }
  *max_revnum = uVar5;
  if (*min_revnum_initialized == true) {
    uVar5 = *min_revnum;
  }
  else {
    *min_revnum = uVar4;
    *min_revnum_initialized = true;
    uVar5 = uVar4;
  }
  if (uVar5 < uVar4) {
    uVar4 = uVar5;
  }
  *min_revnum = uVar4;
LAB_0010b8a6:
  std::__cxx11::string::~string((string *)&ext);
  return;
}

Assistant:

void SimpleLogger::findMinMaxRevNumInternal(bool& min_revnum_initialized,
                                            size_t& min_revnum,
                                            size_t& max_revnum,
                                            std::string& f_name)
{
    size_t last_dot = f_name.rfind(".");
    if (last_dot == std::string::npos) return;

    bool comp_file = false;
    std::string ext = f_name.substr(last_dot + 1, f_name.size() - last_dot - 1);
    if (ext == "gz" && f_name.size() > 7) {
        // Compressed file: asdf.log.123.tar.gz => need to get 123.
        f_name = f_name.substr(0, f_name.size() - 7);
        last_dot = f_name.rfind(".");
        if (last_dot == std::string::npos) return;
        ext = f_name.substr(last_dot + 1, f_name.size() - last_dot - 1);
        comp_file = true;
    }

    size_t revnum = atoi(ext.c_str());
    max_revnum = std::max( max_revnum,
                           ( (comp_file) ? (revnum+1) : (revnum) ) );
    if (!min_revnum_initialized) {
        min_revnum = revnum;
        min_revnum_initialized = true;
    }
    min_revnum = std::min(min_revnum, revnum);
}